

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.cpp
# Opt level: O2

unique_ptr<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>,_true>
 __thiscall
duckdb::ZSTDStorage::StringInitSegment
          (ZSTDStorage *this,ColumnSegment *segment,block_id_t block_id,
          optional_ptr<duckdb::ColumnSegmentState,_true> segment_state)

{
  ColumnSegmentState *pCVar1;
  pointer pUVar2;
  _Head_base<0UL,_duckdb::UncompressedStringSegmentState_*,_false> local_20;
  optional_ptr<duckdb::ColumnSegmentState,_true> local_18;
  
  local_18.ptr = segment_state.ptr;
  make_uniq<duckdb::UncompressedStringSegmentState>();
  if (segment_state.ptr != (ColumnSegmentState *)0x0) {
    pCVar1 = optional_ptr<duckdb::ColumnSegmentState,_true>::operator->(&local_18);
    pUVar2 = unique_ptr<duckdb::UncompressedStringSegmentState,_std::default_delete<duckdb::UncompressedStringSegmentState>,_true>
             ::operator->((unique_ptr<duckdb::UncompressedStringSegmentState,_std::default_delete<duckdb::UncompressedStringSegmentState>,_true>
                           *)&local_20);
    ::std::vector<long,_std::allocator<long>_>::_M_move_assign
              (&(pUVar2->on_disk_blocks).super_vector<long,_std::allocator<long>_>,&pCVar1->blocks);
  }
  *(UncompressedStringSegmentState **)this = local_20._M_head_impl;
  return (unique_ptr<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>_>
          )(unique_ptr<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>_>
            )this;
}

Assistant:

unique_ptr<CompressedSegmentState> ZSTDStorage::StringInitSegment(ColumnSegment &segment, block_id_t block_id,
                                                                  optional_ptr<ColumnSegmentState> segment_state) {
	auto result = make_uniq<UncompressedStringSegmentState>();
	if (segment_state) {
		auto &serialized_state = segment_state->Cast<SerializedStringSegmentState>();
		result->on_disk_blocks = std::move(serialized_state.blocks);
	}
	return std::move(result);
}